

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int acttab_insert(acttab *p,int makeItSafe)

{
  int iVar1;
  lookahead_action *plVar2;
  int local_34;
  int local_30;
  int oldAlloc;
  int end;
  int n;
  int k;
  int j;
  int i;
  int makeItSafe_local;
  acttab *p_local;
  
  if (p->nLookahead < 1) {
    __assert_fail("p->nLookahead>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/lemon.c",0x2aa,
                  "int acttab_insert(acttab *, int)");
  }
  iVar1 = p->nsymbol + 1;
  if (p->nActionAlloc <= p->nAction + iVar1) {
    k = p->nActionAlloc;
    p->nActionAlloc = p->nAction + iVar1 + p->nActionAlloc + 0x14;
    plVar2 = (lookahead_action *)realloc(p->aAction,(long)p->nActionAlloc << 3);
    p->aAction = plVar2;
    if (p->aAction == (lookahead_action *)0x0) {
      fprintf(_stderr,"malloc failed\n");
      exit(1);
    }
    for (; k < p->nActionAlloc; k = k + 1) {
      p->aAction[k].lookahead = -1;
      p->aAction[k].action = -1;
    }
  }
  if (makeItSafe == 0) {
    local_30 = 0;
  }
  else {
    local_30 = p->mnLookahead;
  }
  k = p->nAction;
  do {
    do {
      do {
        k = k + -1;
        if (k < local_30) goto LAB_00102986;
      } while ((p->aAction[k].lookahead != p->mnLookahead) || (p->aAction[k].action != p->mnAction))
      ;
      n = 0;
      while ((((n < p->nLookahead &&
               (iVar1 = (p->aLookahead[n].lookahead - p->mnLookahead) + k, -1 < iVar1)) &&
              (iVar1 < p->nAction)) &&
             ((p->aLookahead[n].lookahead == p->aAction[iVar1].lookahead &&
              (p->aLookahead[n].action == p->aAction[iVar1].action))))) {
        n = n + 1;
      }
    } while (n < p->nLookahead);
    oldAlloc = 0;
    for (n = 0; n < p->nAction; n = n + 1) {
      if ((-1 < p->aAction[n].lookahead) && (p->aAction[n].lookahead == (n + p->mnLookahead) - k)) {
        oldAlloc = oldAlloc + 1;
      }
    }
  } while (oldAlloc != p->nLookahead);
LAB_00102986:
  if (k < local_30) {
    if (makeItSafe == 0) {
      local_34 = 0;
    }
    else {
      local_34 = p->mnLookahead;
    }
    for (k = local_34; k < p->nActionAlloc - p->mxLookahead; k = k + 1) {
      if (p->aAction[k].lookahead < 0) {
        n = 0;
        while (((n < p->nLookahead &&
                (iVar1 = (p->aLookahead[n].lookahead - p->mnLookahead) + k, -1 < iVar1)) &&
               (p->aAction[iVar1].lookahead < 0))) {
          n = n + 1;
        }
        if (p->nLookahead <= n) {
          for (n = 0; (n < p->nAction && (p->aAction[n].lookahead != (n + p->mnLookahead) - k));
              n = n + 1) {
          }
          if (n == p->nAction) break;
        }
      }
    }
  }
  for (n = 0; n < p->nLookahead; n = n + 1) {
    iVar1 = (p->aLookahead[n].lookahead - p->mnLookahead) + k;
    p->aAction[iVar1] = p->aLookahead[n];
    if (p->nAction <= iVar1) {
      p->nAction = iVar1 + 1;
    }
  }
  if ((makeItSafe != 0) && (p->nAction <= k + p->nterminal)) {
    p->nAction = k + p->nterminal + 1;
  }
  p->nLookahead = 0;
  return k - p->mnLookahead;
}

Assistant:

int acttab_insert(acttab *p, int makeItSafe){
  int i, j, k, n, end;
  assert( p->nLookahead>0 );

  /* Make sure we have enough space to hold the expanded action table
  ** in the worst case.  The worst case occurs if the transaction set
  ** must be appended to the current action table
  */
  n = p->nsymbol + 1;
  if( p->nAction + n >= p->nActionAlloc ){
    int oldAlloc = p->nActionAlloc;
    p->nActionAlloc = p->nAction + n + p->nActionAlloc + 20;
    p->aAction = (struct lookahead_action *) realloc( p->aAction,
                          sizeof(p->aAction[0])*p->nActionAlloc);
    if( p->aAction==0 ){
      fprintf(stderr,"malloc failed\n");
      exit(1);
    }
    for(i=oldAlloc; i<p->nActionAlloc; i++){
      p->aAction[i].lookahead = -1;
      p->aAction[i].action = -1;
    }
  }

  /* Scan the existing action table looking for an offset that is a
  ** duplicate of the current transaction set.  Fall out of the loop
  ** if and when the duplicate is found.
  **
  ** i is the index in p->aAction[] where p->mnLookahead is inserted.
  */
  end = makeItSafe ? p->mnLookahead : 0;
  for(i=p->nAction-1; i>=end; i--){
    if( p->aAction[i].lookahead==p->mnLookahead ){
      /* All lookaheads and actions in the aLookahead[] transaction
      ** must match against the candidate aAction[i] entry. */
      if( p->aAction[i].action!=p->mnAction ) continue;
      for(j=0; j<p->nLookahead; j++){
        k = p->aLookahead[j].lookahead - p->mnLookahead + i;
        if( k<0 || k>=p->nAction ) break;
        if( p->aLookahead[j].lookahead!=p->aAction[k].lookahead ) break;
        if( p->aLookahead[j].action!=p->aAction[k].action ) break;
      }
      if( j<p->nLookahead ) continue;

      /* No possible lookahead value that is not in the aLookahead[]
      ** transaction is allowed to match aAction[i] */
      n = 0;
      for(j=0; j<p->nAction; j++){
        if( p->aAction[j].lookahead<0 ) continue;
        if( p->aAction[j].lookahead==j+p->mnLookahead-i ) n++;
      }
      if( n==p->nLookahead ){
        break;  /* An exact match is found at offset i */
      }
    }
  }

  /* If no existing offsets exactly match the current transaction, find an
  ** an empty offset in the aAction[] table in which we can add the
  ** aLookahead[] transaction.
  */
  if( i<end ){
    /* Look for holes in the aAction[] table that fit the current
    ** aLookahead[] transaction.  Leave i set to the offset of the hole.
    ** If no holes are found, i is left at p->nAction, which means the
    ** transaction will be appended. */
    i = makeItSafe ? p->mnLookahead : 0;
    for(; i<p->nActionAlloc - p->mxLookahead; i++){
      if( p->aAction[i].lookahead<0 ){
        for(j=0; j<p->nLookahead; j++){
          k = p->aLookahead[j].lookahead - p->mnLookahead + i;
          if( k<0 ) break;
          if( p->aAction[k].lookahead>=0 ) break;
        }
        if( j<p->nLookahead ) continue;
        for(j=0; j<p->nAction; j++){
          if( p->aAction[j].lookahead==j+p->mnLookahead-i ) break;
        }
        if( j==p->nAction ){
          break;  /* Fits in empty slots */
        }
      }
    }
  }
  /* Insert transaction set at index i. */
#if 0
  printf("Acttab:");
  for(j=0; j<p->nLookahead; j++){
    printf(" %d", p->aLookahead[j].lookahead);
  }
  printf(" inserted at %d\n", i);
#endif
  for(j=0; j<p->nLookahead; j++){
    k = p->aLookahead[j].lookahead - p->mnLookahead + i;
    p->aAction[k] = p->aLookahead[j];
    if( k>=p->nAction ) p->nAction = k+1;
  }
  if( makeItSafe && i+p->nterminal>=p->nAction ) p->nAction = i+p->nterminal+1;
  p->nLookahead = 0;

  /* Return the offset that is added to the lookahead in order to get the
  ** index into yy_action of the action */
  return i - p->mnLookahead;
}